

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall ON_Material::Read(ON_Material *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ON_Texture *object;
  uint count;
  int textures_major_version;
  int major_version;
  int textures_minor_version;
  int minor_version;
  ON__UINT32 local_34;
  int local_30;
  int local_2c [3];
  
  operator=(this,&Unset);
  iVar4 = ON_BinaryArchive::Archive3dmVersion(archive);
  if ((iVar4 < 0x3c) ||
     (uVar5 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive), uVar5 < 0x8c005c76)) {
    bVar1 = Internal_ReadV5(this,archive);
    return bVar1;
  }
  local_2c[0] = 0;
  local_2c[2] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_2c,local_2c + 2);
  if (!bVar1) {
    return false;
  }
  if (((((local_2c[0] == 1) &&
        (bVar1 = ON_ModelComponent::ReadModelComponentAttributes
                           (&this->super_ON_ModelComponent,archive), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_plugin_id), bVar1)) &&
      (((bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_ambient), bVar1 &&
        (bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_diffuse), bVar1)) &&
       ((bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_emission), bVar1 &&
        ((bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_specular), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_reflection), bVar1)))))))) &&
     (bVar1 = ON_BinaryArchive::ReadColor(archive,&this->m_transparent), bVar1)) {
    RemoveColorAlphaValues(this);
    bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_index_of_refraction);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_reflectivity), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_shine), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_transparency);
      bVar3 = false;
      if (!bVar1) goto LAB_004d876e;
      local_30 = 0;
      local_2c[1] = 0;
      bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_30,local_2c + 1);
      if (!bVar1) goto LAB_004d876c;
      if (local_30 == 1) {
        local_34 = 0;
        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_34);
        if (!bVar1) goto LAB_004d868c;
        uVar6 = (ulong)(this->m_textures).super_ON_ClassArray<ON_Texture>.m_capacity;
        if (-1 < (long)uVar6) {
          (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count = 0;
        }
        if (uVar6 < local_34) {
          ON_ClassArray<ON_Texture>::SetCapacity
                    (&(this->m_textures).super_ON_ClassArray<ON_Texture>,(ulong)local_34);
        }
        if (local_34 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          do {
            object = ON_ClassArray<ON_Texture>::AppendNew
                               (&(this->m_textures).super_ON_ClassArray<ON_Texture>);
            iVar4 = ON_BinaryArchive::ReadObject(archive,&object->super_ON_Object);
            if (iVar4 == 0) break;
            uVar5 = uVar5 + 1;
          } while (uVar5 < local_34);
        }
        bVar1 = local_34 <= uVar5;
      }
      else {
LAB_004d868c:
        bVar1 = false;
      }
      bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
      bVar3 = false;
      if ((!bVar2) || (!bVar1)) goto LAB_004d876e;
      bVar1 = ON_BinaryArchive::ReadArray(archive,&this->m_material_channel);
      if ((((bVar1) &&
           ((bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_bShareable), bVar1 &&
            (bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_bDisableLighting), bVar1)))) &&
          (bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_bFresnelReflections), bVar1)) &&
         ((((bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_reflection_glossiness), bVar1 &&
            (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_refraction_glossiness), bVar1))
           && (bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_fresnel_index_of_refraction),
              bVar1)) &&
          (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_rdk_material_instance_id), bVar1))))
      {
        bVar3 = ON_BinaryArchive::ReadBool
                          (archive,&this->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
        goto LAB_004d876e;
      }
    }
  }
LAB_004d876c:
  bVar3 = false;
LAB_004d876e:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar3);
}

Assistant:

bool ON_Material::Read( ON_BinaryArchive& archive )
{
  *this = ON_Material::Unset;

  if (archive.Archive3dmVersion() < 60)
    return Internal_ReadV5(archive);
  if (archive.ArchiveOpenNURBSVersion() <  2348833910)
    return Internal_ReadV5(archive);

  bool rc = false;
  int major_version = 0;
  int minor_version = 0;
  if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version))
    return false;
  for (;;)
  {
    if (1 != major_version)
      break;

    if ( !ReadModelComponentAttributes(archive)) break;

    if ( !archive.ReadUuid(m_plugin_id) ) break;

    if ( !archive.ReadColor( m_ambient ) ) break;
    if ( !archive.ReadColor( m_diffuse ) ) break;
    if ( !archive.ReadColor( m_emission ) ) break;
    if ( !archive.ReadColor( m_specular ) ) break;
    if ( !archive.ReadColor( m_reflection ) ) break;
    if ( !archive.ReadColor( m_transparent ) ) break;

    //https://mcneel.myjetbrains.com/youtrack/issue/RH-85216/ONMaterial-diffuse-color-is-ONColorUnsetColor
    RemoveColorAlphaValues();

    if ( !archive.ReadDouble( &m_index_of_refraction ) ) break;
    if ( !archive.ReadDouble( &m_reflectivity ) ) break;
    if ( !archive.ReadDouble( &m_shine ) ) break;
    if (!archive.ReadDouble(&m_transparency)) break;

    // array of textures read in a way that user data persists
    {
      int textures_major_version = 0;
      int textures_minor_version = 0;
      if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK, &textures_major_version, &textures_minor_version))
        break;
      bool textures_chunk_rc = false;
      for (;;)
      {
        if (1 != textures_major_version)
          break;

        unsigned int count = 0;
        if ( !archive.ReadInt(&count) )
          break;
        m_textures.SetCount(0);
        m_textures.Reserve(count);
        unsigned int i;
        for (i = 0; i < count; i++)
        {
          if (!archive.ReadObject(m_textures.AppendNew()))
            break;
        }
        if (i < count)
          break;
        textures_chunk_rc = true;
        break;
      }
      if (!archive.EndRead3dmChunk())
        textures_chunk_rc = false;
      if (!textures_chunk_rc)
        break;
    }

    if ( !archive.ReadArray(m_material_channel) )
      break;
    if ( !archive.ReadBool(&m_bShareable) )
      break;
    if ( !archive.ReadBool(&m_bDisableLighting))
      break;
    if ( !archive.ReadBool(&m_bFresnelReflections))
      break;
    if ( !archive.ReadDouble(&m_reflection_glossiness))
      break;
    if ( !archive.ReadDouble(&m_refraction_glossiness))
      break;
    if ( !archive.ReadDouble(&m_fresnel_index_of_refraction))
      break;
    if ( !archive.ReadUuid(m_rdk_material_instance_id))
      break;
    if ( !archive.ReadBool(&m_bUseDiffuseTextureAlphaForObjectTransparencyTexture))
      break;

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}